

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price.h
# Opt level: O0

uint32_t rc_bittree_price(probability *probs,uint32_t bit_levels,uint32_t symbol)

{
  uint bit_00;
  uint32_t uVar1;
  uint32_t local_1c;
  uint32_t bit;
  uint32_t price;
  uint32_t symbol_local;
  uint32_t bit_levels_local;
  probability *probs_local;
  
  local_1c = 0;
  bit = (1 << ((byte)bit_levels & 0x1f)) + symbol;
  do {
    bit_00 = bit & 1;
    bit = bit >> 1;
    uVar1 = rc_bit_price(probs[bit],bit_00);
    local_1c = uVar1 + local_1c;
  } while (bit != 1);
  return local_1c;
}

Assistant:

static inline uint32_t
rc_bittree_price(const probability *const probs,
		const uint32_t bit_levels, uint32_t symbol)
{
	uint32_t price = 0;
	symbol += UINT32_C(1) << bit_levels;

	do {
		const uint32_t bit = symbol & 1;
		symbol >>= 1;
		price += rc_bit_price(probs[symbol], bit);
	} while (symbol != 1);

	return price;
}